

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<unsigned_char> * __thiscall
Centaurus::CharClass<unsigned_char>::operator|=
          (CharClass<unsigned_char> *this,Range<unsigned_char> *r)

{
  CharClass<unsigned_char> *pCVar1;
  Range<unsigned_char> local_48;
  CharClass<unsigned_char> local_38;
  Range<unsigned_char> *local_18;
  Range<unsigned_char> *r_local;
  CharClass<unsigned_char> *this_local;
  
  local_18 = r;
  r_local = (Range<unsigned_char> *)this;
  Range<unsigned_char>::Range(&local_48,r);
  operator|(&local_38,this,&local_48);
  pCVar1 = operator=(this,&local_38);
  ~CharClass(&local_38);
  Range<unsigned_char>::~Range(&local_48);
  return pCVar1;
}

Assistant:

CharClass<TCHAR>& operator|=(const Range<TCHAR>& r)
    {
        return *this = *this | r;
    }